

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AnsiUdpPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AnsiUdpPortListSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *args_1,Token *args_2,Token *args_3)

{
  Token closeParen;
  Token openParen;
  AnsiUdpPortListSyntax *pAVar1;
  Info *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  undefined8 in_R8;
  Token in_stack_00000000;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pAVar1 = (AnsiUdpPortListSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  openParen.info = in_RSI;
  openParen.kind = (short)in_RDX;
  openParen._2_1_ = (char)((ulong)in_RDX >> 0x10);
  openParen.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  openParen.rawLen = (int)((ulong)in_RDX >> 0x20);
  closeParen.info = in_RCX;
  closeParen.kind = (short)in_R8;
  closeParen._2_1_ = (char)((ulong)in_R8 >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  closeParen.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::AnsiUdpPortListSyntax::AnsiUdpPortListSyntax
            ((AnsiUdpPortListSyntax *)in_RSI->location,openParen,
             (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)in_RSI->rawTextPtr,closeParen,
             in_stack_00000000);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }